

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_type_with_bound_instance.cpp
# Opt level: O2

int main(int param_1,char **argv)

{
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::__cxx11::string::string((string *)&local_28,*argv,&local_69);
  std::operator+(&local_68,"gdb -batch -ex \'file ",&local_28);
  std::operator+(&local_48,&local_68,"\' -ex \'disassemble test\'");
  system(local_48._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

int main(int, char** argv) {
  std::system(("gdb -batch -ex 'file " + std::string{argv[0]} + "' -ex 'disassemble test'").c_str());
}